

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_fence_init(ma_fence *pFence)

{
  undefined4 *in_RDI;
  undefined4 local_14;
  
  if (in_RDI == (undefined4 *)0x0) {
    local_14 = MA_INVALID_ARGS;
  }
  else {
    if (in_RDI != (undefined4 *)0x0) {
      memset(in_RDI,0,4);
    }
    *in_RDI = 0;
    local_14 = MA_SUCCESS;
  }
  return local_14;
}

Assistant:

MA_API ma_result ma_fence_init(ma_fence* pFence)
{
    if (pFence == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pFence);
    pFence->counter = 0;

    #ifndef MA_NO_THREADING
    {
        ma_result result;

        result = ma_event_init(&pFence->e);
        if (result != MA_SUCCESS) {
            return result;
        }
    }
    #endif

    return MA_SUCCESS;
}